

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall
BasicBlock::RemovePred
          (BasicBlock *this,BasicBlock *block,FlowGraph *graph,bool doCleanSucc,bool moveToDead)

{
  undefined1 *puVar1;
  BasicBlock *pBVar2;
  Type pSVar3;
  code *pcVar4;
  bool bVar5;
  Loop *loop;
  Type *ppFVar6;
  undefined4 *puVar7;
  undefined1 local_50 [8];
  EditingIterator iter;
  
  local_50 = (undefined1  [8])&this->predList;
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
  iter.last = (NodeBase *)graph;
  do {
    bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_50);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xc7d,"((0))","Edge not found.");
      if (bVar5) {
        *puVar7 = 0;
        return;
      }
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    ppFVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_50);
  } while ((*ppFVar6)->predBlock != block);
  pBVar2 = (*ppFVar6)->succBlock;
  if (moveToDead) {
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::MoveCurrentTo
              ((EditingIterator *)local_50,
               &(this->deadPredList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>)
    ;
  }
  else {
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
              ((EditingIterator *)local_50,(ArenaAllocator *)(iter.last)->next);
  }
  if (doCleanSucc) {
    RemoveSucc(block,this,(FlowGraph *)iter.last,false,moveToDead);
  }
  if (((pBVar2->field_0x18 & 4) != 0) && (pBVar2->loop != (Loop *)0x0)) {
    pSVar3 = (pBVar2->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar3 != &pBVar2->predList) &&
       ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar3->next == &pBVar2->predList))
    {
      puVar1 = &pBVar2->loop->field_0x178;
      *puVar1 = *puVar1 | 1;
    }
  }
  return;
}

Assistant:

void
BasicBlock::RemovePred(BasicBlock *block, FlowGraph * graph, bool doCleanSucc, bool moveToDead)
{
    FOREACH_SLISTBASECOUNTED_ENTRY_EDITING(FlowEdge*, edge, this->GetPredList(), iter)
    {
        if (edge->GetPred() == block)
        {
            BasicBlock *blockSucc = edge->GetSucc();
            if (moveToDead)
            {
                iter.MoveCurrentTo(this->GetDeadPredList());

            }
            else
            {
                iter.RemoveCurrent(graph->alloc);
            }
            if (doCleanSucc)
            {
                block->RemoveSucc(this, graph, false, moveToDead);
            }
            if (blockSucc->isLoopHeader && blockSucc->loop && blockSucc->GetPredList()->HasOne())
            {
                Loop *loop = blockSucc->loop;
                loop->isDead = true;
            }
            return;
        }
    } NEXT_SLISTBASECOUNTED_ENTRY_EDITING;
    AssertMsg(UNREACHED, "Edge not found.");
}